

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintingTheDecimalEquivalentOfABinaryNumber.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  long in_RAX;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  printf("%s","Enter a valid binary number (up to 5 digits): ");
  __isoc99_scanf("%d",(long)&uStack_38 + 4);
  do {
    uVar1 = uStack_38._4_4_;
    if ((uStack_38 < 0) || (0x2b67 < (int)uStack_38._4_4_)) {
      puts("You have not entered a binary number");
      bVar7 = false;
      printf("%s","Enter a valid binary number (up to 5 digits): ");
      __isoc99_scanf("%d",(long)&uStack_38 + 4);
      uVar4 = 0;
    }
    else {
      uVar2 = uStack_38._4_4_ % 10000;
      uVar6 = uVar2 % 1000;
      uVar5 = uVar6 % 100;
      uVar3 = uVar5 % 10;
      uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
      bVar7 = uVar1 - 10000 < 10000;
      uVar4 = (ulong)bVar7 << 4;
      if (uVar1 % 10000 - 1000 < 1000) {
        uVar4 = (ulong)((uint)bVar7 << 4 | 8);
      }
      else if (999 < uVar2) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",(long)&uStack_38 + 4);
      }
      if (uVar6 - 100 < 100) {
        uVar4 = (ulong)((int)uVar4 + 4);
      }
      else if (99 < uVar6) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",(long)&uStack_38 + 4);
      }
      if (uVar5 - 10 < 10) {
        uVar4 = (ulong)((int)uVar4 + 2);
      }
      else if (9 < uVar5) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",(long)&uStack_38 + 4);
      }
      bVar7 = true;
      if (uVar3 != 0) {
        if (uVar3 == 1) {
          uVar4 = (ulong)((int)uVar4 + 1);
        }
        else {
          puts("You have not entered a binary number");
          bVar7 = false;
          printf("%s","Enter a valid binary number (up to 5 digits): ");
          __isoc99_scanf("%d",(long)&uStack_38 + 4);
        }
      }
    }
  } while (!bVar7);
  printf("%s%d","The decimal equivalent is: ",uVar4);
  return 0;
}

Assistant:

int main (void) {
    int number;
    int flag = 1;
    int numA;
    int numB;
    int numC;
    int numD;
    int numE;
    int decimal = 0;

    printf("%s", "Enter a valid binary number (up to 5 digits): ");
    scanf("%d", &number);
    while (flag != -1) {
        decimal = 0;
        if (number >= 0) {
            if (number <= 11111) {
                numA = number / 10000;
                number = number % 10000;
                numB = number / 1000;
                number = number % 1000;
                numC = number / 100;
                number = number % 100;
                numD = number / 10;
                number = number % 10;
                numE = number;
                if (numA == 1) {
                    decimal = decimal + (numA * 16);
                    flag = -1;

                }
                else if (numA == 0) {
                    decimal = decimal + (numA * 16);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numB == 1) {
                    decimal = decimal + (numB * 8);
                    flag = -1;

                }
                else if (numB == 0) {
                    decimal = decimal + (numB * 8);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numC == 1) {
                    decimal = decimal + (numC * 4);
                    flag = -1;

                }
                else if (numC == 0) {
                    decimal = decimal + (numC * 4);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numD == 1) {
                    decimal = decimal + (numD * 2);
                    flag = -1;

                }
                else if (numD == 0) {
                    decimal = decimal + (numD * 2);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numE == 1) {
                    decimal = decimal + numE ;
                    flag = -1;

                }
                else if (numE == 0) {
                    decimal = decimal + numE;
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

            }
            else {
                puts("You have not entered a binary number");
                printf("%s", "Enter a valid binary number (up to 5 digits): ");
                scanf("%d", &number);
                flag = 1;

            }

        }
        else {
            puts("You have not entered a binary number");
            printf("%s", "Enter a valid binary number (up to 5 digits): ");
            scanf("%d", &number);
            flag = 1;

        }

    }
    printf("%s%d", "The decimal equivalent is: ", decimal);

    return 0;

}